

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_buffer_pool.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::disk_buffer_pool::free_buffer_impl
          (disk_buffer_pool *this,char *buf,unique_lock<std::mutex> *l)

{
  unique_lock<std::mutex> *l_local;
  char *buf_local;
  disk_buffer_pool *this_local;
  
  free(buf);
  this->m_in_use = this->m_in_use + -1;
  return;
}

Assistant:

void disk_buffer_pool::free_buffer_impl(char* buf, std::unique_lock<std::mutex>& l)
	{
		TORRENT_ASSERT(buf);
		TORRENT_ASSERT(m_magic == 0x1337);
		TORRENT_ASSERT(m_settings_set);
		TORRENT_ASSERT(l.owns_lock());
		TORRENT_UNUSED(l);

		std::free(buf);

		--m_in_use;
	}